

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# path.cpp
# Opt level: O3

path * __thiscall boost::filesystem::path::operator/=(path *this,path *p)

{
  size_type sVar1;
  pointer pcVar2;
  char *pcVar3;
  path rhs;
  long *local_38 [2];
  long local_28 [2];
  
  sVar1 = (p->m_pathname)._M_string_length;
  if (sVar1 != 0) {
    if (this == p) {
      pcVar2 = (p->m_pathname)._M_dataplus._M_p;
      local_38[0] = local_28;
      std::__cxx11::string::_M_construct<char*>((string *)local_38,pcVar2,pcVar2 + sVar1);
      if ((((char)*local_38[0] != '/') && (sVar1 = (this->m_pathname)._M_string_length, sVar1 != 0))
         && ((this->m_pathname)._M_dataplus._M_p[sVar1 - 1] != '/')) {
        std::__cxx11::string::push_back((char)this);
      }
      std::__cxx11::string::_M_append((char *)this,(ulong)local_38[0]);
      if (local_38[0] != local_28) {
        operator_delete(local_38[0],local_28[0] + 1);
      }
    }
    else {
      pcVar3 = (p->m_pathname)._M_dataplus._M_p;
      if (((*pcVar3 != '/') && (sVar1 = (this->m_pathname)._M_string_length, sVar1 != 0)) &&
         ((this->m_pathname)._M_dataplus._M_p[sVar1 - 1] != '/')) {
        std::__cxx11::string::push_back((char)this);
        pcVar3 = (p->m_pathname)._M_dataplus._M_p;
      }
      std::__cxx11::string::_M_append((char *)this,(ulong)pcVar3);
    }
  }
  return this;
}

Assistant:

path& path::operator/=(const path& p)
  {
    if (p.empty())
      return *this;
    if (this == &p)  // self-append
    {
      path rhs(p);
      if (!is_separator(rhs.m_pathname[0]))
        m_append_separator_if_needed();
      m_pathname += rhs.m_pathname;
    }
    else
    {
      if (!is_separator(*p.m_pathname.begin()))
        m_append_separator_if_needed();
      m_pathname += p.m_pathname;
    }
    return *this;
  }